

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# klondike.c
# Opt level: O2

_Bool klondike_isWon(Board *board)

{
  GAMEID GVar1;
  uint uVar2;
  Spot *pSVar3;
  uint uVar4;
  uint uVar5;
  
  GVar1 = (gConfig.game)->id;
  if (GVar1 - 0x17 < 2) {
    uVar5 = 0xc;
  }
  else if (GVar1 == DOUBLEKLONDIKETURN1) {
    uVar5 = 8;
  }
  else {
    uVar5 = (uint)(GVar1 == DOUBLEKLONDIKETURN3) * 4 + 4;
  }
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    if (uVar5 <= uVar4) break;
    pSVar3 = board_spotGet(board,FOUNDATION,(uchar)uVar4);
    uVar2 = uVar4 + 1;
  } while (pSVar3->cardsCount == '\r');
  return uVar5 <= uVar4;
}

Assistant:

bool klondike_isWon(Board * board)
{
	unsigned char i;
	unsigned char foundationCount = (gConfig.game->id==TRIPLEKLONDIKETURN1 || gConfig.game->id==TRIPLEKLONDIKETURN3 ? 12 : (gConfig.game->id==DOUBLEKLONDIKETURN1 || gConfig.game->id==DOUBLEKLONDIKETURN3 ? 8 : 4));
	Spot * foundation;
	for(i=0;i<foundationCount;i++)
	{
		foundation = board_spotGet(board, FOUNDATION, i);
		if(foundation->cardsCount!=13)
			return false;
	}

	return true;
}